

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O3

void __thiscall CVmObjVector::alloc_vector(CVmObjVector *this,size_t cnt)

{
  ushort uVar1;
  ushort *puVar2;
  int iVar3;
  undefined4 extraout_var;
  uint16_t tmp;
  
  iVar3 = (*G_mem_X->varheap_->_vptr_CVmVarHeap[4])
                    (G_mem_X->varheap_,(cnt + 7 & 0xfffffffffffffff8) + cnt * 5 + 4,this);
  (this->super_CVmObjCollection).super_CVmObject.ext_ = (char *)CONCAT44(extraout_var,iVar3);
  if (cnt < 0x10000) {
    *(short *)CONCAT44(extraout_var,iVar3) = (short)cnt;
    *(short *)((this->super_CVmObjCollection).super_CVmObject.ext_ + 2) = (short)cnt;
    puVar2 = (ushort *)(this->super_CVmObjCollection).super_CVmObject.ext_;
    uVar1 = *puVar2;
    memset((void *)((long)puVar2 + (ulong)uVar1 * 5 + 4),0,(ulong)(uVar1 + 7 & 0xfffffff8));
    return;
  }
  err_throw(0x7eb);
}

Assistant:

void CVmObjVector::alloc_vector(VMG_ size_t cnt)
{
    /* allocate space for the given number of elements */
    ext_ = (char *)G_mem->get_var_heap()->alloc_mem(calc_alloc(cnt), this);

    /* set the element count and allocated count */
    set_allocated_count(cnt);
    set_element_count(cnt);

    /* clear the undo bits */
    clear_undo_bits();
}